

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O1

void secp256k1_fe_from_signed62(secp256k1_fe *r,secp256k1_modinv64_signed62 *a)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uint uVar5;
  secp256k1_fe *psVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  secp256k1_fe *factor;
  ulong *extraout_RDX;
  long lVar11;
  long lVar12;
  long lVar13;
  secp256k1_modinv64_signed62 *a_00;
  secp256k1_fe *psVar14;
  int iVar15;
  int alen;
  secp256k1_fe *psVar16;
  long lVar17;
  secp256k1_fe *psVar18;
  secp256k1_modinv64_signed62 *psVar19;
  secp256k1_fe *psVar20;
  secp256k1_modinv64_signed62 *a_01;
  uint64_t *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint64_t *puVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  secp256k1_fe *psVar30;
  ulong uVar31;
  bool bVar32;
  secp256k1_modinv64_signed62 sStack_128;
  secp256k1_modinv64_signed62 sStack_100;
  secp256k1_fe *psStack_d8;
  secp256k1_fe *psStack_d0;
  secp256k1_fe *psStack_c8;
  ulong uStack_b8;
  secp256k1_fe *psStack_b0;
  ulong uStack_a8;
  secp256k1_fe *psStack_a0;
  secp256k1_fe *psStack_98;
  secp256k1_fe *psStack_90;
  secp256k1_fe *psStack_88;
  uint64_t uStack_80;
  secp256k1_fe *psStack_78;
  secp256k1_fe *psStack_70;
  secp256k1_fe *psStack_68;
  secp256k1_fe *psStack_60;
  uint64_t uStack_58;
  secp256k1_fe *psStack_50;
  uint64_t uStack_48;
  uint64_t uStack_40;
  
  uVar8 = a->v[0];
  if (uVar8 >> 0x3e == 0) {
    uVar9 = a->v[1];
    if (0x3fffffffffffffff < uVar9) goto LAB_00118793;
    uVar23 = a->v[2];
    if (0x3fffffffffffffff < uVar23) goto LAB_00118798;
    uVar27 = a->v[3];
    if (0x3fffffffffffffff < uVar27) goto LAB_0011879d;
    uVar22 = a->v[4];
    if (uVar22 < 0x100) {
      r->n[0] = uVar8 & 0xfffffffffffff;
      r->n[1] = (uVar9 & 0x3ffffffffff) << 10 | uVar8 >> 0x34;
      r->n[2] = (uVar23 & 0xffffffff) << 0x14 | uVar9 >> 0x2a;
      r->n[3] = (ulong)((uint)uVar27 & 0x3fffff) << 0x1e | uVar23 >> 0x20;
      r->n[4] = uVar22 << 0x28 | uVar27 >> 0x16;
      return;
    }
  }
  else {
    secp256k1_fe_from_signed62_cold_5();
LAB_00118793:
    secp256k1_fe_from_signed62_cold_4();
LAB_00118798:
    secp256k1_fe_from_signed62_cold_3();
LAB_0011879d:
    secp256k1_fe_from_signed62_cold_2();
  }
  secp256k1_fe_from_signed62_cold_1();
  uVar1 = r->n[0];
  uStack_40 = r->n[1];
  psStack_50 = (secp256k1_fe *)r->n[2];
  uStack_58 = r->n[3];
  psVar30 = (secp256k1_fe *)r->n[4];
  psStack_98 = (secp256k1_fe *)((secp256k1_fe *)a)->n[0];
  psVar18 = (secp256k1_fe *)((secp256k1_fe *)a)->n[1];
  uStack_48 = ((secp256k1_fe *)a)->n[2];
  psVar6 = (secp256k1_fe *)((secp256k1_fe *)a)->n[3];
  uStack_a8 = *extraout_RDX;
  psStack_a0 = (secp256k1_fe *)extraout_RDX[1];
  uStack_b8 = extraout_RDX[2];
  psStack_b0 = (secp256k1_fe *)extraout_RDX[3];
  uStack_80 = ((secp256k1_fe *)a)->n[4];
  psVar16 = (secp256k1_fe *)0x5;
  factor = (secp256k1_fe *)0xfffffffffffffffe;
  psStack_c8 = (secp256k1_fe *)0x118840;
  psVar20 = r;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)r,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar4 < 1) {
    psStack_c8 = (secp256k1_fe *)0x119175;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_00119175:
    psStack_c8 = (secp256k1_fe *)0x11917a;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_0011917a:
    psStack_c8 = (secp256k1_fe *)0x11917f;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_0011917f:
    psStack_c8 = (secp256k1_fe *)0x119184;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_00119184:
    psStack_c8 = (secp256k1_fe *)0x119189;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_00119189:
    psStack_c8 = (secp256k1_fe *)0x11918e;
    secp256k1_modinv64_update_de_62_cold_23();
LAB_0011918e:
    psStack_c8 = (secp256k1_fe *)0x119193;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_00119193:
    psStack_c8 = (secp256k1_fe *)0x119198;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar14 = psVar18;
LAB_00119198:
    psStack_c8 = (secp256k1_fe *)0x11919d;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_0011919d:
    psStack_c8 = (secp256k1_fe *)0x1191a2;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_001191a2:
    psStack_c8 = (secp256k1_fe *)0x1191a7;
    secp256k1_modinv64_update_de_62_cold_5();
LAB_001191a7:
    psStack_c8 = (secp256k1_fe *)0x1191ac;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_001191ac:
    psStack_c8 = (secp256k1_fe *)0x1191b1;
    secp256k1_modinv64_update_de_62_cold_7();
    psVar18 = psVar16;
LAB_001191b1:
    psStack_c8 = (secp256k1_fe *)0x1191b6;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_001191b6:
    psStack_c8 = (secp256k1_fe *)0x1191bb;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_001191bb:
    psStack_c8 = (secp256k1_fe *)0x1191c0;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_001191c0:
    psStack_c8 = (secp256k1_fe *)0x1191c5;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_001191c5:
    psStack_c8 = (secp256k1_fe *)0x1191ca;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_001191ca:
    iVar4 = (int)psVar18;
    psStack_c8 = (secp256k1_fe *)0x1191cf;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_001191cf:
    iVar15 = iVar4;
    psStack_c8 = (secp256k1_fe *)0x1191d4;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_001191d4:
    psStack_c8 = (secp256k1_fe *)0x1191d9;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_001191d9:
    alen = iVar15;
    r = psVar14;
    psStack_c8 = (secp256k1_fe *)0x1191de;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_001191de:
    psStack_c8 = (secp256k1_fe *)0x1191e3;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_001191e3:
    psStack_c8 = (secp256k1_fe *)0x1191e8;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_001191e8:
    psStack_c8 = (secp256k1_fe *)0x1191ed;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_001191ed:
    psStack_c8 = (secp256k1_fe *)0x1191f2;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_001191f2:
    a = (secp256k1_modinv64_signed62 *)psVar20;
    psStack_c8 = (secp256k1_fe *)0x1191f7;
    secp256k1_modinv64_update_de_62_cold_18();
  }
  else {
    factor = (secp256k1_fe *)0x1;
    psVar16 = (secp256k1_fe *)0x5;
    psStack_c8 = (secp256k1_fe *)0x118861;
    psVar20 = r;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)r,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar4) goto LAB_00119175;
    psVar16 = (secp256k1_fe *)0x5;
    factor = (secp256k1_fe *)0xfffffffffffffffe;
    psStack_c8 = (secp256k1_fe *)0x118884;
    psVar20 = (secp256k1_fe *)a;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar4 < 1) goto LAB_0011917a;
    factor = (secp256k1_fe *)0x1;
    psVar16 = (secp256k1_fe *)0x5;
    psStack_c8 = (secp256k1_fe *)0x1188a5;
    psVar20 = (secp256k1_fe *)a;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar4) goto LAB_0011917f;
    psStack_c8 = (secp256k1_fe *)0x1188cb;
    psStack_88 = psVar30;
    psStack_68 = psVar6;
    psVar6 = (secp256k1_fe *)secp256k1_modinv64_abs(uStack_a8);
    psStack_c8 = (secp256k1_fe *)0x1188d8;
    psVar20 = psStack_a0;
    iVar7 = secp256k1_modinv64_abs((int64_t)psStack_a0);
    factor = (secp256k1_fe *)(0x4000000000000000 - iVar7);
    psVar30 = (secp256k1_fe *)0x3fffffffffffffff;
    if ((long)factor < (long)psVar6) goto LAB_00119184;
    psStack_c8 = (secp256k1_fe *)0x1188f4;
    psVar6 = (secp256k1_fe *)secp256k1_modinv64_abs(uStack_b8);
    psStack_c8 = (secp256k1_fe *)0x118901;
    psVar20 = psStack_b0;
    iVar7 = secp256k1_modinv64_abs((int64_t)psStack_b0);
    factor = (secp256k1_fe *)(0x4000000000000000 - iVar7);
    if ((long)factor < (long)psVar6) goto LAB_00119189;
    psVar30 = (secp256k1_fe *)0x7fffffffffffffff;
    psVar16 = (secp256k1_fe *)(uStack_a8 * uVar1);
    factor = SUB168(SEXT816((long)uStack_a8) * SEXT816((long)uVar1),8);
    uVar8 = (long)psStack_a0 * (long)psStack_98;
    lVar11 = SUB168(SEXT816((long)psStack_a0) * SEXT816((long)psStack_98),8);
    lVar17 = (0x7fffffffffffffff - lVar11) - (long)factor;
    psVar20 = psStack_98;
    psStack_60 = psVar18;
    if (-1 < lVar11 &&
        (SBORROW8(0x7fffffffffffffff - lVar11,(long)factor) !=
        SBORROW8(lVar17,(ulong)((secp256k1_fe *)~uVar8 < psVar16))) !=
        (long)(lVar17 - (ulong)((secp256k1_fe *)~uVar8 < psVar16)) < 0) goto LAB_0011918e;
    puVar25 = (uint64_t *)((long)psVar16->n + uVar8);
    lVar26 = (long)factor->n + (ulong)CARRY8(uVar8,(ulong)psVar16) + lVar11;
    psVar6 = (secp256k1_fe *)(uStack_b8 * uVar1);
    lVar12 = SUB168(SEXT816((long)uStack_b8) * SEXT816((long)uVar1),8);
    uVar9 = (long)psStack_b0 * (long)psStack_98;
    lVar13 = SUB168(SEXT816((long)psStack_b0) * SEXT816((long)psStack_98),8);
    uVar8 = (ulong)((secp256k1_fe *)(-uVar9 - 1) < psVar6);
    lVar17 = (0x7fffffffffffffff - lVar13) - lVar12;
    lVar11 = lVar17 - uVar8;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar12) != SBORROW8(lVar17,uVar8)) == lVar11 < 0;
    factor = (secp256k1_fe *)CONCAT71((int7)((ulong)lVar11 >> 8),lVar13 < 0 || bVar32);
    if (lVar13 >= 0 && !bVar32) goto LAB_00119193;
    factor = (secp256k1_fe *)((long)uStack_80 >> 0x3f);
    lVar17 = ((ulong)psStack_a0 & (ulong)factor) + (uStack_a8 & (long)psStack_88 >> 0x3f);
    puVar21 = (uint64_t *)((long)psVar6->n + uVar9);
    psVar20 = (secp256k1_fe *)(lVar13 + lVar12 + (ulong)CARRY8(uVar9,(ulong)psVar6));
    psStack_70 = (secp256k1_fe *)
                 (lVar17 - ((long)puVar25 * 0x27c7f6e22ddacacf + lVar17 & 0x3fffffffffffffffU));
    psVar6 = (secp256k1_fe *)((long)psStack_70 * -0x1000003d1);
    lVar11 = SUB168(SEXT816((long)psStack_70) * SEXT816(-0x1000003d1),8);
    uVar8 = (ulong)((undefined1 *)((long)psStack_70 * 0x1000003d1 - 1U) < puVar25);
    lVar17 = (0x7fffffffffffffff - lVar11) - lVar26;
    psVar14 = (secp256k1_fe *)
              ((-0x8000000000000000 - lVar11) - (ulong)(psVar6 != (secp256k1_fe *)0x0));
    uVar9 = (ulong)(puVar25 < (undefined1 *)((long)psStack_70 * 0x1000003d1));
    bVar32 = (SBORROW8(lVar26,(long)psVar14) != SBORROW8(lVar26 - (long)psVar14,uVar9)) ==
             (long)((lVar26 - (long)psVar14) - uVar9) < 0;
    if ((long)psStack_70 < 1) {
      bVar32 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar26) != SBORROW8(lVar17,uVar8)) ==
               (long)(lVar17 - uVar8) < 0;
    }
    psVar16 = psStack_70;
    psStack_98 = r;
    psStack_90 = (secp256k1_fe *)a;
    if (!bVar32) goto LAB_00119198;
    lVar17 = ((ulong)factor & (ulong)psStack_b0) + ((long)psStack_88 >> 0x3f & uStack_b8);
    factor = (secp256k1_fe *)
             (lVar17 - ((long)puVar21 * 0x27c7f6e22ddacacf + lVar17 & 0x3fffffffffffffffU));
    bVar32 = CARRY8((ulong)psVar6,(ulong)puVar25);
    psVar6 = (secp256k1_fe *)((long)puVar25 + (long)psVar6->n);
    lVar26 = lVar11 + lVar26 + (ulong)bVar32;
    psVar16 = (secp256k1_fe *)((long)factor >> 0x3f);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = factor;
    uVar9 = SUB168(auVar2 * ZEXT816(0xfffffffefffffc2f),0);
    psVar14 = (secp256k1_fe *)-(long)factor;
    lVar12 = (long)psVar14 +
             (long)psVar16 * -0x1000003d1 + SUB168(auVar2 * ZEXT816(0xfffffffefffffc2f),8);
    uVar8 = (ulong)((undefined1 *)(-uVar9 - 1) < puVar21);
    lVar17 = (0x7fffffffffffffff - lVar12) - (long)psVar20;
    lVar13 = (-0x8000000000000000 - lVar12) - (ulong)(uVar9 != 0);
    lVar11 = (long)psVar20 - lVar13;
    bVar32 = (SBORROW8((long)psVar20,lVar13) !=
             SBORROW8(lVar11,(ulong)(puVar21 < (undefined1 *)-uVar9))) ==
             (long)(lVar11 - (ulong)(puVar21 < (undefined1 *)-uVar9)) < 0;
    if ((long)factor < 1) {
      bVar32 = (SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar20) != SBORROW8(lVar17,uVar8)) ==
               (long)(lVar17 - uVar8) < 0;
    }
    psStack_78 = psVar16;
    if (!bVar32) goto LAB_0011919d;
    lVar17 = (long)psVar20 + (ulong)CARRY8(uVar9,(ulong)puVar21) + lVar12;
    if (((ulong)psVar6 & 0x3fffffffffffffff) != 0) goto LAB_001191a2;
    if (((long)puVar21 + uVar9 & 0x3fffffffffffffff) != 0) goto LAB_001191a7;
    uVar8 = (ulong)psVar6 >> 0x3e | lVar26 * 4;
    uVar23 = uStack_a8 * uStack_40 + uVar8;
    psVar20 = (secp256k1_fe *)
              (SUB168(SEXT816((long)uStack_a8) * SEXT816((long)uStack_40),8) + (lVar26 >> 0x3e) +
              (ulong)CARRY8(uStack_a8 * uStack_40,uVar8));
    psVar6 = (secp256k1_fe *)((long)psStack_a0 * (long)psVar18);
    lVar13 = SUB168(SEXT816((long)psStack_a0) * SEXT816((long)psVar18),8);
    uVar8 = (ulong)(-(long)psVar6 - 1U < uVar23);
    lVar11 = (0x7fffffffffffffff - lVar13) - (long)psVar20;
    lVar26 = (-0x8000000000000000 - lVar13) - (ulong)(psVar6 != (secp256k1_fe *)0x0);
    lVar12 = (long)psVar20 - lVar26;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar13,(long)psVar20) != SBORROW8(lVar11,uVar8)) ==
             (long)(lVar11 - uVar8) < 0;
    if (lVar13 < 0) {
      bVar32 = (SBORROW8((long)psVar20,lVar26) !=
               SBORROW8(lVar12,(ulong)(uVar23 < (ulong)-(long)psVar6))) ==
               (long)(lVar12 - (ulong)(uVar23 < (ulong)-(long)psVar6)) < 0;
    }
    psVar14 = psVar18;
    if (!bVar32) goto LAB_001191ac;
    uVar8 = (long)puVar21 + uVar9 >> 0x3e | lVar17 * 4;
    uVar27 = uStack_b8 * uStack_40 + uVar8;
    lVar26 = SUB168(SEXT816((long)uStack_b8) * SEXT816((long)uStack_40),8) + (lVar17 >> 0x3e) +
             (ulong)CARRY8(uStack_b8 * uStack_40,uVar8);
    uVar9 = (long)psStack_b0 * (long)psVar18;
    lVar12 = SUB168(SEXT816((long)psStack_b0) * SEXT816((long)psVar18),8);
    uVar8 = (ulong)(-uVar9 - 1 < uVar27);
    lVar17 = (0x7fffffffffffffff - lVar12) - lVar26;
    lVar29 = (-0x8000000000000000 - lVar12) - (ulong)(uVar9 != 0);
    lVar11 = lVar26 - lVar29;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar12,lVar26) != SBORROW8(lVar17,uVar8)) ==
             (long)(lVar17 - uVar8) < 0;
    if (lVar12 < 0) {
      bVar32 = (SBORROW8(lVar26,lVar29) != SBORROW8(lVar11,(ulong)(uVar27 < -uVar9))) ==
               (long)(lVar11 - (ulong)(uVar27 < -uVar9)) < 0;
    }
    psVar14 = (secp256k1_fe *)(ulong)bVar32;
    psVar18 = psVar16;
    if (bVar32 == false) goto LAB_001191b1;
    psVar18 = (secp256k1_fe *)0x7fffffffffffffff;
    uVar10 = (long)psVar6->n + uVar23;
    lVar17 = (long)psVar20->n + (ulong)CARRY8(uVar23,(ulong)psVar6) + lVar13;
    lVar12 = lVar26 + lVar12 + (ulong)CARRY8(uVar27,uVar9);
    uVar8 = lVar17 * 4 | uVar10 >> 0x3e;
    psVar6 = (secp256k1_fe *)(uVar27 + uVar9 & 0x3fffffffffffffff);
    uVar22 = uStack_a8 * (long)psStack_50 + uVar8;
    psVar20 = (secp256k1_fe *)
              ((lVar17 >> 0x3e) + SUB168(SEXT816((long)uStack_a8) * SEXT816((long)psStack_50),8) +
              (ulong)CARRY8(uStack_a8 * (long)psStack_50,uVar8));
    uVar23 = (long)psStack_a0 * uStack_48;
    lVar11 = SUB168(SEXT816((long)psStack_a0) * SEXT816((long)uStack_48),8);
    uVar8 = (ulong)(-uVar23 - 1 < uVar22);
    lVar17 = (0x7fffffffffffffff - lVar11) - (long)psVar20;
    psVar14 = (secp256k1_fe *)((-0x8000000000000000 - lVar11) - (ulong)(uVar23 != 0));
    r->n[0] = uVar10 & 0x3fffffffffffffff;
    ((secp256k1_fe *)a)->n[0] = (uint64_t)psVar6;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar11,(long)psVar20) != SBORROW8(lVar17,uVar8)) ==
             (long)(lVar17 - uVar8) < 0;
    if (lVar11 < 0) {
      bVar32 = (SBORROW8((long)psVar20,(long)psVar14) !=
               SBORROW8((long)psVar20 - (long)psVar14,(ulong)(uVar22 < -uVar23))) ==
               (long)(((long)psVar20 - (long)psVar14) - (ulong)(uVar22 < -uVar23)) < 0;
    }
    psVar30 = psStack_50;
    if (!bVar32) goto LAB_001191b6;
    uVar8 = uVar27 + uVar9 >> 0x3e | lVar12 * 4;
    uVar27 = uStack_b8 * (long)psStack_50 + uVar8;
    psVar6 = (secp256k1_fe *)
             (SUB168(SEXT816((long)uStack_b8) * SEXT816((long)psStack_50),8) + (lVar12 >> 0x3e) +
             (ulong)CARRY8(uStack_b8 * (long)psStack_50,uVar8));
    uVar9 = (long)psStack_b0 * uStack_48;
    lVar13 = SUB168(SEXT816((long)psStack_b0) * SEXT816((long)uStack_48),8);
    uVar8 = (ulong)(-uVar9 - 1 < uVar27);
    lVar17 = (0x7fffffffffffffff - lVar13) - (long)psVar6;
    lVar26 = (-0x8000000000000000 - lVar13) - (ulong)(uVar9 != 0);
    lVar12 = (long)psVar6 - lVar26;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar13,(long)psVar6) != SBORROW8(lVar17,uVar8)) ==
             (long)(lVar17 - uVar8) < 0;
    if (lVar13 < 0) {
      bVar32 = (SBORROW8((long)psVar6,lVar26) != SBORROW8(lVar12,(ulong)(uVar27 < -uVar9))) ==
               (long)(lVar12 - (ulong)(uVar27 < -uVar9)) < 0;
    }
    if (!bVar32) goto LAB_001191bb;
    lVar17 = (long)psVar20->n + (ulong)CARRY8(uVar22,uVar23) + lVar11;
    psVar6 = (secp256k1_fe *)((long)psVar6->n + (ulong)CARRY8(uVar27,uVar9) + lVar13);
    uVar8 = lVar17 * 4 | uVar22 + uVar23 >> 0x3e;
    uVar24 = uStack_a8 * uStack_58 + uVar8;
    psVar20 = (secp256k1_fe *)
              ((lVar17 >> 0x3e) + SUB168(SEXT816((long)uStack_a8) * SEXT816((long)uStack_58),8) +
              (ulong)CARRY8(uStack_a8 * uStack_58,uVar8));
    uVar10 = (long)psStack_a0 * (long)psStack_68;
    lVar11 = SUB168(SEXT816((long)psStack_a0) * SEXT816((long)psStack_68),8);
    uVar8 = (ulong)(-uVar10 - 1 < uVar24);
    lVar17 = (0x7fffffffffffffff - lVar11) - (long)psVar20;
    psVar18 = (secp256k1_fe *)0x0;
    psVar14 = (secp256k1_fe *)((-0x8000000000000000 - lVar11) - (ulong)(uVar10 != 0));
    r->n[1] = uVar22 + uVar23 & 0x3fffffffffffffff;
    ((secp256k1_fe *)a)->n[1] = uVar27 + uVar9 & 0x3fffffffffffffff;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar11,(long)psVar20) != SBORROW8(lVar17,uVar8)) ==
             (long)(lVar17 - uVar8) < 0;
    if (lVar11 < 0) {
      bVar32 = (SBORROW8((long)psVar20,(long)psVar14) !=
               SBORROW8((long)psVar20 - (long)psVar14,(ulong)(uVar24 < -uVar10))) ==
               (long)(((long)psVar20 - (long)psVar14) - (ulong)(uVar24 < -uVar10)) < 0;
    }
    psVar30 = psStack_68;
    if (!bVar32) goto LAB_001191c0;
    uVar8 = uVar27 + uVar9 >> 0x3e | (long)psVar6 * 4;
    uVar23 = uStack_b8 * uStack_58 + uVar8;
    lVar13 = SUB168(SEXT816((long)uStack_b8) * SEXT816((long)uStack_58),8) + ((long)psVar6 >> 0x3e)
             + (ulong)CARRY8(uStack_b8 * uStack_58,uVar8);
    uVar9 = (long)psStack_b0 * (long)psStack_68;
    lVar12 = SUB168(SEXT816((long)psStack_b0) * SEXT816((long)psStack_68),8);
    psVar30 = (secp256k1_fe *)0x7fffffffffffffff;
    uVar8 = (ulong)(-uVar9 - 1 < uVar23);
    lVar17 = (0x7fffffffffffffff - lVar12) - lVar13;
    psVar6 = (secp256k1_fe *)((-0x8000000000000000 - lVar12) - (ulong)(uVar9 != 0));
    bVar32 = (SBORROW8(lVar13,(long)psVar6) !=
             SBORROW8(lVar13 - (long)psVar6,(ulong)(uVar23 < -uVar9))) ==
             (long)((lVar13 - (long)psVar6) - (ulong)(uVar23 < -uVar9)) < 0;
    psVar14 = (secp256k1_fe *)(ulong)bVar32;
    bVar3 = (SBORROW8(0x7fffffffffffffff - lVar12,lVar13) != SBORROW8(lVar17,uVar8)) ==
            (long)(lVar17 - uVar8) < 0;
    if (lVar12 < 0) {
      bVar3 = bVar32;
    }
    if (!bVar3) goto LAB_001191c5;
    lVar17 = (long)psVar20->n + (ulong)CARRY8(uVar24,uVar10) + lVar11;
    lVar12 = lVar13 + lVar12 + (ulong)CARRY8(uVar23,uVar9);
    uVar8 = lVar17 * 4 | uVar24 + uVar10 >> 0x3e;
    uVar22 = uStack_a8 * (long)psStack_88 + uVar8;
    psVar20 = (secp256k1_fe *)
              ((lVar17 >> 0x3e) + SUB168(SEXT816((long)uStack_a8) * SEXT816((long)psStack_88),8) +
              (ulong)CARRY8(uStack_a8 * (long)psStack_88,uVar8));
    uVar27 = (long)psStack_a0 * uStack_80;
    lVar11 = SUB168(SEXT816((long)psStack_a0) * SEXT816((long)uStack_80),8);
    uVar8 = (ulong)(-uVar27 - 1 < uVar22);
    lVar17 = (0x7fffffffffffffff - lVar11) - (long)psVar20;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar11,(long)psVar20) != SBORROW8(lVar17,uVar8)) ==
             (long)(lVar17 - uVar8) < 0;
    psVar14 = (secp256k1_fe *)CONCAT71((int7)(-uVar27 - 1 >> 8),bVar32);
    lVar13 = (-0x8000000000000000 - lVar11) - (ulong)(uVar27 != 0);
    lVar17 = (long)psVar20 - lVar13;
    r->n[2] = uVar24 + uVar10 & 0x3fffffffffffffff;
    ((secp256k1_fe *)a)->n[2] = uVar23 + uVar9 & 0x3fffffffffffffff;
    if (lVar11 < 0) {
      bVar32 = (SBORROW8((long)psVar20,lVar13) != SBORROW8(lVar17,(ulong)(uVar22 < -uVar27))) ==
               (long)(lVar17 - (ulong)(uVar22 < -uVar27)) < 0;
    }
    psVar18 = psStack_88;
    psVar6 = r;
    if (!bVar32) goto LAB_001191ca;
    uVar8 = uVar23 + uVar9 >> 0x3e | lVar12 * 4;
    uVar23 = uVar22 + uVar27;
    psVar20 = (secp256k1_fe *)((long)psVar20->n + (ulong)CARRY8(uVar22,uVar27) + lVar11);
    uVar27 = uStack_b8 * (long)psStack_88 + uVar8;
    lVar12 = SUB168(SEXT816((long)uStack_b8) * SEXT816((long)psStack_88),8) + (lVar12 >> 0x3e) +
             (ulong)CARRY8(uStack_b8 * (long)psStack_88,uVar8);
    uVar9 = (long)psStack_b0 * uStack_80;
    lVar11 = SUB168(SEXT816((long)psStack_b0) * SEXT816((long)uStack_80),8);
    uVar8 = (ulong)(-uVar9 - 1 < uVar27);
    lVar17 = (0x7fffffffffffffff - lVar11) - lVar12;
    iVar15 = 0;
    alen = 0;
    psVar6 = (secp256k1_fe *)((-0x8000000000000000 - lVar11) - (ulong)(uVar9 != 0));
    bVar32 = (SBORROW8(lVar12,(long)psVar6) !=
             SBORROW8(lVar12 - (long)psVar6,(ulong)(uVar27 < -uVar9))) ==
             (long)((lVar12 - (long)psVar6) - (ulong)(uVar27 < -uVar9)) < 0;
    psVar14 = (secp256k1_fe *)(ulong)bVar32;
    bVar3 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar12) != SBORROW8(lVar17,uVar8)) ==
            (long)(lVar17 - uVar8) < 0;
    if (lVar11 < 0) {
      bVar3 = bVar32;
    }
    iVar4 = 0;
    if (!bVar3) goto LAB_001191cf;
    uVar22 = uVar27 + uVar9;
    lVar11 = lVar12 + lVar11 + (ulong)CARRY8(uVar27,uVar9);
    uVar10 = ((long)psStack_70 >> 0x3f) << 8 | (ulong)psStack_70 >> 0x38;
    uVar27 = (long)psStack_70 * 0x100;
    uVar8 = (ulong)((long)psStack_70 * -0x100 - 1U < uVar23);
    lVar17 = (0x7fffffffffffffff - uVar10) - (long)psVar20;
    psVar6 = (secp256k1_fe *)((-0x8000000000000000 - uVar10) - (ulong)(uVar27 != 0));
    uVar9 = (ulong)(uVar23 < (ulong)((long)psStack_70 * -0x100));
    bVar32 = (SBORROW8((long)psVar20,(long)psVar6) != SBORROW8((long)psVar20 - (long)psVar6,uVar9))
             == (long)(((long)psVar20 - (long)psVar6) - uVar9) < 0;
    psVar14 = (secp256k1_fe *)(ulong)bVar32;
    bVar3 = (SBORROW8(0x7fffffffffffffff - uVar10,(long)psVar20) != SBORROW8(lVar17,uVar8)) ==
            (long)(lVar17 - uVar8) < 0;
    if ((long)psStack_70 < 0) {
      bVar3 = bVar32;
    }
    if (!bVar3) goto LAB_001191d4;
    uVar28 = (long)psVar16 << 8 | (ulong)factor >> 0x38;
    uVar24 = (long)factor * 0x100;
    uVar8 = (ulong)((long)factor * -0x100 - 1U < uVar22);
    lVar17 = (0x7fffffffffffffff - uVar28) - lVar11;
    psVar6 = (secp256k1_fe *)((-0x8000000000000000 - uVar28) - (ulong)(uVar24 != 0));
    uVar9 = (ulong)(uVar22 < (ulong)((long)factor * -0x100));
    psVar30 = (secp256k1_fe *)((lVar11 - (long)psVar6) - uVar9);
    bVar32 = (long)factor < 0;
    factor = (secp256k1_fe *)
             (ulong)((SBORROW8(lVar11,(long)psVar6) != SBORROW8(lVar11 - (long)psVar6,uVar9)) ==
                    (long)psVar30 < 0);
    psVar14 = (secp256k1_fe *)
              (ulong)((SBORROW8(0x7fffffffffffffff - uVar28,lVar11) != SBORROW8(lVar17,uVar8)) ==
                     (long)(lVar17 - uVar8) < 0);
    if (bVar32) {
      psVar14 = factor;
    }
    iVar15 = 0;
    if ((char)psVar14 == '\0') goto LAB_001191d9;
    lVar17 = (long)psVar20->n + CARRY8(uVar23,uVar27) + uVar10;
    lVar11 = lVar11 + uVar28 + (ulong)CARRY8(uVar22,uVar24);
    uVar8 = lVar17 * 4 | uVar23 + uVar27 >> 0x3e;
    r->n[3] = uVar23 + uVar27 & 0x3fffffffffffffff;
    ((secp256k1_fe *)a)->n[3] = uVar22 + uVar24 & 0x3fffffffffffffff;
    factor = (secp256k1_fe *)(uVar8 + 0x8000000000000000);
    psVar20 = (secp256k1_fe *)((lVar17 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar8));
    if (psVar20 != (secp256k1_fe *)0xffffffffffffffff) goto LAB_001191de;
    factor = (secp256k1_fe *)0xffffffffffffffff;
    uVar9 = uVar22 + uVar24 >> 0x3e | lVar11 * 4;
    r->n[4] = uVar8;
    alen = (int)uVar9;
    if ((lVar11 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar9) != -1) goto LAB_001191e3;
    ((secp256k1_fe *)a)->n[4] = uVar9;
    alen = 5;
    factor = (secp256k1_fe *)0xfffffffffffffffe;
    psStack_c8 = (secp256k1_fe *)0x1190f1;
    psVar20 = r;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)r,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar4 < 1) goto LAB_001191e8;
    factor = (secp256k1_fe *)0x1;
    alen = 5;
    psStack_c8 = (secp256k1_fe *)0x119112;
    psVar20 = r;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)r,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar4) goto LAB_001191ed;
    alen = 5;
    factor = (secp256k1_fe *)0xfffffffffffffffe;
    psStack_c8 = (secp256k1_fe *)0x119135;
    psVar20 = (secp256k1_fe *)a;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar4 < 1) goto LAB_001191f2;
    factor = (secp256k1_fe *)0x1;
    alen = 5;
    psStack_c8 = (secp256k1_fe *)0x119156;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (iVar4 < 0) {
      return;
    }
  }
  psStack_c8 = (secp256k1_fe *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_17();
  a_01 = &sStack_128;
  psStack_d8 = r;
  psStack_d0 = psVar30;
  psStack_c8 = psVar6;
  secp256k1_modinv64_mul_62(&sStack_100,a,alen,1);
  psVar19 = a_00;
  secp256k1_modinv64_mul_62(&sStack_128,a_00,5,(int64_t)factor);
  lVar17 = 0;
  while ((ulong)sStack_100.v[lVar17] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_128.v[lVar17]) goto LAB_0011928c;
    lVar17 = lVar17 + 1;
    if (lVar17 == 4) {
      uVar5 = 4;
      while( true ) {
        if (sStack_100.v[uVar5] < sStack_128.v[uVar5]) {
          return;
        }
        if (sStack_128.v[uVar5] < sStack_100.v[uVar5]) break;
        bVar32 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar32) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0011928c:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  lVar17 = a_01->v[0];
  uVar8 = a_01->v[1];
  uVar9 = a_01->v[2];
  uVar23 = a_01->v[3];
  lVar11 = a_01->v[4];
  lVar12 = 0;
  do {
    if (a_01->v[lVar12] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_001194b6:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_001194bb;
    }
    if (0x3fffffffffffffff < a_01->v[lVar12]) goto LAB_001194b6;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 5);
  iVar4 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar4 < 1) {
LAB_001194bb:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_001194c0:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_001194c5:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar4 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar4) goto LAB_001194c0;
    uVar27 = lVar11 >> 0x3f;
    uVar31 = (long)psVar19 >> 0x3f;
    uVar22 = (lVar17 + (uVar27 & 0xfffffffefffffc2f) ^ uVar31) - uVar31;
    uVar10 = ((long)uVar22 >> 0x3e) + ((uVar8 ^ uVar31) - uVar31);
    uVar24 = ((long)uVar10 >> 0x3e) + ((uVar9 ^ uVar31) - uVar31);
    uVar28 = ((long)uVar24 >> 0x3e) + ((uVar23 ^ uVar31) - uVar31);
    lVar17 = ((long)uVar28 >> 0x3e) + (((uVar27 & 0x100) + lVar11 ^ uVar31) - uVar31);
    uVar23 = lVar17 >> 0x3f;
    uVar8 = (uVar23 & 0xfffffffefffffc2f) + (uVar22 & 0x3fffffffffffffff);
    uVar9 = ((long)uVar8 >> 0x3e) + (uVar10 & 0x3fffffffffffffff);
    uVar27 = ((long)uVar9 >> 0x3e) + (uVar24 & 0x3fffffffffffffff);
    uVar22 = ((long)uVar27 >> 0x3e) + (uVar28 & 0x3fffffffffffffff);
    uVar23 = ((long)uVar22 >> 0x3e) + (uVar23 & 0x100) + lVar17;
    a_01->v[0] = uVar8 & 0x3fffffffffffffff;
    a_01->v[1] = uVar9 & 0x3fffffffffffffff;
    a_01->v[2] = uVar27 & 0x3fffffffffffffff;
    a_01->v[3] = uVar22 & 0x3fffffffffffffff;
    a_01->v[4] = uVar23;
    if (0x3fffffffffffffff < uVar23) goto LAB_001194c5;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,0);
    if (-1 < iVar4) {
      iVar4 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (iVar4 < 0) {
        return;
      }
      goto LAB_001194cf;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_001194cf:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_fe_from_signed62(secp256k1_fe *r, const secp256k1_modinv64_signed62 *a) {
    const uint64_t M52 = UINT64_MAX >> 12;
    const uint64_t a0 = a->v[0], a1 = a->v[1], a2 = a->v[2], a3 = a->v[3], a4 = a->v[4];

    /* The output from secp256k1_modinv64{_var} should be normalized to range [0,modulus), and
     * have limbs in [0,2^62). The modulus is < 2^256, so the top limb must be below 2^(256-62*4).
     */
    VERIFY_CHECK(a0 >> 62 == 0);
    VERIFY_CHECK(a1 >> 62 == 0);
    VERIFY_CHECK(a2 >> 62 == 0);
    VERIFY_CHECK(a3 >> 62 == 0);
    VERIFY_CHECK(a4 >> 8 == 0);

    r->n[0] =  a0                   & M52;
    r->n[1] = (a0 >> 52 | a1 << 10) & M52;
    r->n[2] = (a1 >> 42 | a2 << 20) & M52;
    r->n[3] = (a2 >> 32 | a3 << 30) & M52;
    r->n[4] = (a3 >> 22 | a4 << 40);
}